

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::MembraneHook::wrap(MembraneHook *this,ClientHook *cap,MembranePolicy *policy,bool reverse)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  Entry *pEVar4;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  ClientHook *extraout_RDX_05;
  ClientHook *extraout_RDX_06;
  ClientHook *pCVar5;
  ClientHook *extraout_RDX_07;
  ClientHook *extraout_RDX_08;
  Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
  *table;
  RawBrandedSchema *pRVar6;
  Own<capnp::ClientHook,_std::nullptr_t> OVar7;
  undefined8 local_a8;
  long *plStack_a0;
  _func_int **local_98;
  RawBrandedSchema *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  long *plStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  long *plStack_70;
  ClientHook *local_68;
  long *local_60;
  ClientHook *local_58;
  long *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  anon_class_8_1_ba1d3b32_conflict local_38;
  long *plVar2;
  
  if ((undefined1 *)cap->brand == &(anonymous_namespace)::DUMMY) {
    iVar1 = (*policy->_vptr_MembranePolicy[8])(policy);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    plVar3 = (long *)(**(code **)(*cap[3].brand + 0x40))();
    if ((plVar3 == plVar2) && ((bool)*(char *)&cap[4]._vptr_ClientHook == !reverse)) {
      (**(code **)(*cap[2].brand + 0x20))(&local_a8);
      if (reverse) {
        local_58 = local_a8;
        local_50 = plStack_a0;
        (**(code **)(*plVar2 + 0x48))(&local_48,plVar2,&local_58,cap[3].brand,policy);
        plVar2 = local_50;
        *(undefined4 *)&(this->super_ClientHook)._vptr_ClientHook = local_48;
        *(undefined4 *)((long)&(this->super_ClientHook)._vptr_ClientHook + 4) = uStack_44;
        *(undefined4 *)&(this->super_ClientHook).brand = (undefined4)uStack_40;
        *(undefined4 *)((long)&(this->super_ClientHook).brand + 4) = uStack_40._4_4_;
        pCVar5 = extraout_RDX;
        if (local_50 == (long *)0x0) goto LAB_0031701e;
        local_50 = (long *)0x0;
        pCVar5 = local_58;
      }
      else {
        local_68 = local_a8;
        local_60 = plStack_a0;
        (**(code **)(*plVar2 + 0x50))(&local_48,plVar2,&local_68,cap[3].brand,policy);
        plVar2 = local_60;
        *(undefined4 *)&(this->super_ClientHook)._vptr_ClientHook = local_48;
        *(undefined4 *)((long)&(this->super_ClientHook)._vptr_ClientHook + 4) = uStack_44;
        *(undefined4 *)&(this->super_ClientHook).brand = (undefined4)uStack_40;
        *(undefined4 *)((long)&(this->super_ClientHook).brand + 4) = uStack_40._4_4_;
        pCVar5 = extraout_RDX_07;
        if (local_60 == (long *)0x0) goto LAB_0031701e;
        local_60 = (long *)0x0;
        pCVar5 = local_68;
      }
      uStack_40 = 0;
      (**pCVar5->_vptr_ClientHook)(pCVar5,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      pCVar5 = extraout_RDX_08;
      goto LAB_0031701e;
    }
  }
  table = &(policy->wrappers).table;
  if (reverse) {
    table = &(policy->reverseWrappers).table;
  }
  local_a8 = cap;
  local_38.cap = cap;
  pEVar4 = kj::
           Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
           ::
           FindOrCreateImpl<capnp::MembraneHook::wrap(capnp::ClientHook&,capnp::MembranePolicy&,bool)::{lambda()#1},capnp::ClientHook*&>
           ::apply<0ul>(table,(ClientHook **)&local_a8,&local_38);
  pRVar6 = (pEVar4->value).super_Schema.raw;
  if (pRVar6 == (RawBrandedSchema *)0x0) {
    if (reverse) {
      (*cap->_vptr_ClientHook[4])(&local_a8,cap);
      local_78 = (undefined4)local_a8;
      uStack_74 = local_a8._4_4_;
      plStack_70 = plStack_a0;
      plStack_a0 = (long *)0x0;
      (*policy->_vptr_MembranePolicy[6])(&local_98,policy);
      plVar2 = plStack_70;
      pRVar6 = local_90;
      (this->super_ClientHook)._vptr_ClientHook = local_98;
      (this->super_ClientHook).brand = local_90;
      local_90 = (RawBrandedSchema *)0x0;
      pCVar5 = extraout_RDX_01;
      if (plStack_70 != (long *)0x0) {
        plStack_70 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_74,local_78))
                  ((undefined8 *)CONCAT44(uStack_74,local_78),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
        pCVar5 = extraout_RDX_02;
      }
      plVar2 = plStack_a0;
      if (plStack_a0 != (long *)0x0) {
        plStack_a0 = (long *)0x0;
        (**local_a8->_vptr_ClientHook)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        pCVar5 = extraout_RDX_03;
      }
    }
    else {
      (*cap->_vptr_ClientHook[4])(&local_a8,cap);
      local_88 = (undefined4)local_a8;
      uStack_84 = local_a8._4_4_;
      plStack_80 = plStack_a0;
      plStack_a0 = (long *)0x0;
      (*policy->_vptr_MembranePolicy[7])(&local_98,policy);
      plVar2 = plStack_80;
      pRVar6 = local_90;
      (this->super_ClientHook)._vptr_ClientHook = local_98;
      (this->super_ClientHook).brand = local_90;
      local_90 = (RawBrandedSchema *)0x0;
      pCVar5 = extraout_RDX_04;
      if (plStack_80 != (long *)0x0) {
        plStack_80 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_84,local_88))
                  ((undefined8 *)CONCAT44(uStack_84,local_88),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
        pCVar5 = extraout_RDX_05;
      }
      plVar2 = plStack_a0;
      if (plStack_a0 != (long *)0x0) {
        plStack_a0 = (long *)0x0;
        (**local_a8->_vptr_ClientHook)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        pCVar5 = extraout_RDX_06;
      }
    }
    (pEVar4->value).super_Schema.raw = pRVar6;
  }
  else {
    (*(code *)pRVar6->generic->membersByName)(this);
    pCVar5 = extraout_RDX_00;
  }
LAB_0031701e:
  OVar7.ptr = pCVar5;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

static kj::Own<ClientHook> wrap(ClientHook& cap, MembranePolicy& policy, bool reverse) {
    if (cap.isBrand(MEMBRANE_BRAND)) {
      auto& otherMembrane = kj::downcast<MembraneHook>(cap);
      auto& rootPolicy = policy.rootPolicy();
      if (&otherMembrane.policy->rootPolicy() == &rootPolicy &&
          otherMembrane.reverse == !reverse) {
        // Capability that passed across the membrane one way is now passing back the other way.
        // Unwrap it rather than double-wrap it.
        Capability::Client unwrapped(otherMembrane.inner->addRef());
        return ClientHook::from(
            reverse ? rootPolicy.importInternal(kj::mv(unwrapped), *otherMembrane.policy, policy)
                    : rootPolicy.exportExternal(kj::mv(unwrapped), *otherMembrane.policy, policy));
      }
    }

    auto& map = reverse ? policy.reverseWrappers : policy.wrappers;
    ClientHook*& slot = map.findOrCreate(&cap, [&]() -> kj::Decay<decltype(map)>::Entry {
      return { &cap, nullptr };
    });
    if (slot == nullptr) {
      auto result = ClientHook::from(
          reverse ? policy.importExternal(Capability::Client(cap.addRef()))
                  : policy.exportInternal(Capability::Client(cap.addRef())));
      slot = result;
      return result;
    } else {
      return slot->addRef();
    }
  }